

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  bool bVar1;
  uint32_t number;
  
  WriteUInt32ToUtf16CharSequence(*(uint32_t *)(this->descriptor_ + 4),output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    WriteUInt32ToUtf16CharSequence(this->messageBitIndex_,output);
  }
  io::Printer::Print(printer,&this->variables_,"\"$name$_\",\n");
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
}